

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot-intermediate.cxx
# Opt level: O0

Parameters * parseCommandLine(int argc,char **argv)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  Parameters *in_RDI;
  ArgException *e;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  argSolutionName;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  argEdgesFileName;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  argNodesFileName;
  CmdLine tclap;
  Parameters *parameters;
  Parameters *in_stack_fffffffffffff850;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this;
  allocator<char> *in_stack_fffffffffffff880;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff888;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff890;
  string *in_stack_fffffffffffff898;
  string *desc;
  string *in_stack_fffffffffffff8a0;
  string *name;
  string *in_stack_fffffffffffff8a8;
  string *flag;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff8b0;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  string *in_stack_fffffffffffff8b8;
  int argc_00;
  undefined8 in_stack_fffffffffffff8c0;
  char delim;
  CmdLine *this_01;
  string *in_stack_fffffffffffff8c8;
  CmdLineInterface *parser;
  CmdLine *in_stack_fffffffffffff8d0;
  Visitor *v;
  allocator<char> local_6c9;
  string local_6c8 [32];
  string local_6a8 [39];
  undefined1 local_681 [40];
  undefined1 local_659 [40];
  undefined1 local_631 [33];
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_610;
  undefined1 local_4f9 [33];
  string local_4d8 [39];
  undefined1 local_4b1 [40];
  undefined1 local_489 [40];
  allocator<char> local_461;
  string local_460 [32];
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_440;
  undefined1 local_329 [33];
  string local_308 [39];
  undefined8 local_2e1;
  undefined8 local_2b9;
  allocator<char> local_291;
  string local_290 [32];
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_270;
  allocator<char> local_159;
  string local_158 [55];
  allocator<char> local_121;
  string local_120 [32];
  undefined1 local_19;
  
  delim = (char)((ulong)in_stack_fffffffffffff8c0 >> 0x38);
  local_19 = '\0';
  Parameters::Parameters(in_stack_fffffffffffff850);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff890,(char *)in_stack_fffffffffffff888,in_stack_fffffffffffff880);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff890,(char *)in_stack_fffffffffffff888,in_stack_fffffffffffff880);
  TCLAP::CmdLine::CmdLine
            (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,delim,in_stack_fffffffffffff8b8,
             SUB81((ulong)in_stack_fffffffffffff8b0 >> 0x38,0));
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff890,(char *)in_stack_fffffffffffff888,in_stack_fffffffffffff880);
  v = (Visitor *)&local_2b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff890,(char *)in_stack_fffffffffffff888,in_stack_fffffffffffff880);
  parser = (CmdLineInterface *)&local_2e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff890,(char *)in_stack_fffffffffffff888,in_stack_fffffffffffff880);
  std::__cxx11::string::string(local_308,(string *)&in_RDI->nodesFileName);
  this_01 = (CmdLine *)local_329;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff890,(char *)in_stack_fffffffffffff888,in_stack_fffffffffffff880);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg(in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,
             in_stack_fffffffffffff898,SUB81((ulong)in_stack_fffffffffffff890 >> 0x38,0),
             in_stack_fffffffffffff888,(string *)this_01,parser,v);
  std::__cxx11::string::~string((string *)(local_329 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_329);
  std::__cxx11::string::~string(local_308);
  std::__cxx11::string::~string((string *)((long)&local_2e1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  std::__cxx11::string::~string((string *)((long)&local_2b9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator(&local_291);
  argc_00 = (int)((ulong)&local_461 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff890,(char *)in_stack_fffffffffffff888,in_stack_fffffffffffff880);
  this_00 = (ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_489;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff890,(char *)in_stack_fffffffffffff888,in_stack_fffffffffffff880);
  flag = (string *)local_4b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff890,(char *)in_stack_fffffffffffff888,in_stack_fffffffffffff880);
  std::__cxx11::string::string(local_4d8,(string *)in_RDI);
  name = (string *)local_4f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff890,(char *)in_stack_fffffffffffff888,in_stack_fffffffffffff880);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg(this_00,flag,name,in_stack_fffffffffffff898,
             SUB81((ulong)in_stack_fffffffffffff890 >> 0x38,0),in_stack_fffffffffffff888,
             (string *)this_01,parser,v);
  std::__cxx11::string::~string((string *)(local_4f9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_4f9);
  std::__cxx11::string::~string(local_4d8);
  std::__cxx11::string::~string((string *)(local_4b1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_4b1);
  std::__cxx11::string::~string((string *)(local_489 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_489);
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator(&local_461);
  desc = (string *)local_631;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff890,(char *)in_stack_fffffffffffff888,in_stack_fffffffffffff880);
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_659;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (pbVar1,(char *)in_stack_fffffffffffff888,in_stack_fffffffffffff880);
  val = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_681;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(pbVar1,(char *)val,in_stack_fffffffffffff880);
  std::__cxx11::string::string(local_6a8,(string *)&in_RDI->solutionName);
  __a = &local_6c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(pbVar1,(char *)val,__a);
  this = (ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&stack0xffffffffffffff00;
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg(this_00,flag,name,desc,SUB81((ulong)pbVar1 >> 0x38,0),val,(string *)this_01,parser,v);
  std::__cxx11::string::~string(local_6c8);
  std::allocator<char>::~allocator(&local_6c9);
  std::__cxx11::string::~string(local_6a8);
  std::__cxx11::string::~string((string *)(local_681 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_681);
  std::__cxx11::string::~string((string *)(local_659 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_659);
  std::__cxx11::string::~string((string *)(local_631 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_631);
  TCLAP::CmdLine::parse(this_01,argc_00,(char **)this_00);
  pbVar1 = TCLAP::
           ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::getValue(&local_440);
  std::__cxx11::string::operator=((string *)in_RDI,(string *)pbVar1);
  pbVar1 = TCLAP::
           ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::getValue(&local_270);
  std::__cxx11::string::operator=((string *)&in_RDI->nodesFileName,(string *)pbVar1);
  pbVar1 = TCLAP::
           ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::getValue(&local_610);
  std::__cxx11::string::operator=((string *)&in_RDI->solutionName,(string *)pbVar1);
  local_19 = 1;
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ValueArg(this);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ValueArg(this);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~ValueArg(this);
  TCLAP::CmdLine::~CmdLine((CmdLine *)this);
  if ((local_19 & 1) == 0) {
    Parameters::~Parameters((Parameters *)this);
  }
  return in_RDI;
}

Assistant:

Parameters parseCommandLine(int argc, char** argv)
try
{
    Parameters parameters;

    TCLAP::CmdLine tclap("track", ' ', "1.0");
    TCLAP::ValueArg<string> argNodesFileName("n", "nodes-file", "nodes information", true, parameters.nodesFileName, "nodes-file", tclap);
    TCLAP::ValueArg<string> argEdgesFileName("e", "edges-file", "edges information", true, parameters.edgesFileName, "edges-file", tclap);
    TCLAP::ValueArg<string> argSolutionName("s", "solution-name", "solution name", true, parameters.solutionName, "solution-name", tclap);
    
    tclap.parse(argc, argv);

    parameters.edgesFileName = argEdgesFileName.getValue();
    parameters.nodesFileName = argNodesFileName.getValue();
    parameters.solutionName = argSolutionName.getValue();

    return parameters;
}
catch(TCLAP::ArgException& e)
{
    throw runtime_error(e.error());
}